

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_init(iso9660_conflict *iso9660,vdd *vdd,idr *idr)

{
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  
  *in_RDX = 0;
  *(undefined4 *)(in_RDX + 5) = 0;
  if (*(int *)(in_RSI + 8) != 1) {
    if ((*(uint *)(in_RDI + 0x10370) >> 0xe & 7) < 4) {
      memcpy(in_RDX + 7,"",0x80);
    }
    else {
      memcpy(in_RDX + 7,"",0x80);
      idr_relaxed_filenames((char *)(in_RDX + 7));
    }
  }
  return;
}

Assistant:

static void
idr_init(struct iso9660 *iso9660, struct vdd *vdd, struct idr *idr)
{

	idr->idrent_pool = NULL;
	idr->pool_size = 0;
	if (vdd->vdd_type != VDD_JOLIET) {
		if (iso9660->opt.iso_level <= 3) {
			memcpy(idr->char_map, d_characters_map,
			    sizeof(idr->char_map));
		} else {
			memcpy(idr->char_map, d1_characters_map,
			    sizeof(idr->char_map));
			idr_relaxed_filenames(idr->char_map);
		}
	}
}